

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm_fwd.hpp
# Opt level: O1

comm * __thiscall mxx::comm::split(comm *__return_storage_ptr__,comm *this,int color)

{
  MPI_Comm *ppoVar1;
  
  __return_storage_ptr__->_vptr_comm = (_func_int **)&PTR__comm_0014c088;
  ppoVar1 = &__return_storage_ptr__->mpi_comm;
  __return_storage_ptr__->mpi_comm = (MPI_Comm)&ompi_mpi_comm_world;
  MPI_Comm_size(&ompi_mpi_comm_world,&__return_storage_ptr__->m_size);
  MPI_Comm_rank(__return_storage_ptr__->mpi_comm,&__return_storage_ptr__->m_rank);
  __return_storage_ptr__->do_free = false;
  MPI_Comm_split(this->mpi_comm,color,this->m_rank,ppoVar1);
  MPI_Comm_size(*ppoVar1,&__return_storage_ptr__->m_size);
  MPI_Comm_rank(*ppoVar1,&__return_storage_ptr__->m_rank);
  __return_storage_ptr__->do_free = true;
  return __return_storage_ptr__;
}

Assistant:

comm split(int color) const {
        comm o;
        MPI_Comm_split(this->mpi_comm, color, this->rank(), &o.mpi_comm);
        o.init_ranksize();
        o.do_free = true;
        return o;
    }